

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma__is_channel_map_valid(ma_channel *channelMap,ma_uint32 channels)

{
  ma_channel *pmVar1;
  ma_bool32 mVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  mVar2 = 1;
  if (*channelMap != '\0') {
    if (channels == 0) {
LAB_00104fa8:
      mVar2 = 0;
    }
    else {
      uVar3 = 1;
      uVar4 = 0;
      while (uVar4 != channels) {
        uVar5 = uVar3;
        while (uVar5 < channels) {
          pmVar1 = channelMap + uVar5;
          uVar5 = uVar5 + 1;
          if (channelMap[uVar4] == *pmVar1) goto LAB_00104fa8;
        }
        uVar3 = uVar3 + 1;
        uVar4 = uVar4 + 1;
      }
    }
  }
  return mVar2;
}

Assistant:

static ma_bool32 ma__is_channel_map_valid(const ma_channel* channelMap, ma_uint32 channels)
{
    /* A blank channel map should be allowed, in which case it should use an appropriate default which will depend on context. */
    if (channelMap[0] != MA_CHANNEL_NONE) {
        ma_uint32 iChannel;

        if (channels == 0) {
            return MA_FALSE;   /* No channels. */
        }

        /* A channel cannot be present in the channel map more than once. */
        for (iChannel = 0; iChannel < channels; ++iChannel) {
            ma_uint32 jChannel;
            for (jChannel = iChannel + 1; jChannel < channels; ++jChannel) {
                if (channelMap[iChannel] == channelMap[jChannel]) {
                    return MA_FALSE;
                }
            }
        }
    }

    return MA_TRUE;
}